

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O1

void __thiscall db_packer::process_file(db_packer *this,string *path)

{
  pointer *pppdVar1;
  uint8_t *buf;
  iterator __position;
  int iVar2;
  uint uVar3;
  xr_reader *pxVar4;
  undefined4 extraout_var;
  size_t size;
  db_file *file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (xray_re::xr_file_system::instance()::instance0 == '\0') {
    iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0);
    if (iVar2 != 0) {
      xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
      __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                   &xray_re::xr_file_system::instance::instance0,&__dso_handle);
      __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
    }
  }
  std::operator+(&local_50,&this->m_root,path);
  pxVar4 = xray_re::xr_file_system::r_open
                     (&xray_re::xr_file_system::instance::instance0,local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pxVar4 != (xr_reader *)0x0) {
    iVar2 = (*this->m_archive->_vptr_xr_writer[4])();
    buf = pxVar4->m_data;
    if (pxVar4->m_end < buf) {
      __assert_fail("m_data <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_reader.h"
                    ,0x7a,"size_t xray_re::xr_reader::size() const");
    }
    size = (long)pxVar4->m_end - (long)buf;
    uVar3 = crc32(buf,size);
    (*this->m_archive->_vptr_xr_writer[2])(this->m_archive,pxVar4->m_data,size);
    (*pxVar4->_vptr_xr_reader[1])(pxVar4);
    local_50._M_dataplus._M_p = (pointer)operator_new(0x40);
    (((db_file *)local_50._M_dataplus._M_p)->path)._M_dataplus._M_p =
         (pointer)&(((db_file *)local_50._M_dataplus._M_p)->path).field_2;
    (((db_file *)local_50._M_dataplus._M_p)->path)._M_string_length = 0;
    (((db_file *)local_50._M_dataplus._M_p)->path).field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)local_50._M_dataplus._M_p);
    *(uint *)(local_50._M_dataplus._M_p + 0x38) = uVar3;
    *(size_t *)(local_50._M_dataplus._M_p + 0x20) = CONCAT44(extraout_var,iVar2);
    *(size_t *)(local_50._M_dataplus._M_p + 0x28) = size;
    *(size_t *)(local_50._M_dataplus._M_p + 0x30) = size;
    __position._M_current =
         (this->m_files).
         super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_files).
        super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<db_tools::db_file*,std::allocator<db_tools::db_file*>>::
      _M_realloc_insert<db_tools::db_file*const&>
                ((vector<db_tools::db_file*,std::allocator<db_tools::db_file*>> *)&this->m_files,
                 __position,(db_file **)&local_50);
    }
    else {
      *__position._M_current = (db_file *)local_50._M_dataplus._M_p;
      pppdVar1 = &(this->m_files).
                  super__Vector_base<db_tools::db_file_*,_std::allocator<db_tools::db_file_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppdVar1 = *pppdVar1 + 1;
    }
  }
  return;
}

Assistant:

void db_packer::process_file(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(m_root + path);
	if (r) {
		size_t offset = m_archive->tell(), size = r->size();
		uint32_t crc = crc32(r->data(), size);
		m_archive->w_raw(r->data(), size);
		fs.r_close(r);

		db_file* file = new db_file;
		file->path = path;
		file->crc = crc;
		file->offset = offset;
		file->size_real = size;
		file->size_compressed = size;
		m_files.push_back(file);
	}
}